

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O2

void dgrminer::save_pattern
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<int,_std::allocator<int>_> *graph_ids,results_crate *results,
               bool set_of_graphs,PartialUnion *pu,int pattern_support_absolute,
               double support_relative,
               set<int,_std::less<int>,_std::allocator<int>_> *antecedent_occurrences,
               double confidence,bool verbose)

{
  pointer paVar1;
  pointer piVar2;
  PartialUnion *this;
  size_type sVar3;
  undefined7 in_register_00000009;
  int j;
  long lVar4;
  size_t i;
  ulong uVar5;
  allocator_type local_dd;
  int pattern_support_absolute_local;
  array<int,_6UL> result_edge;
  double confidence_local;
  undefined4 local_9c;
  vector<int,_std::allocator<int>_> *local_98;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_90;
  double support_relative_local;
  PartialUnion *local_80;
  vector<int,_std::allocator<int>_> occurrences_vector;
  set<int,_std::less<int>,_std::allocator<int>_> already_saved_node_ids;
  
  results->saved_instances = results->saved_instances + 1;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pattern_support_absolute_local = pattern_support_absolute;
  confidence_local = confidence;
  local_98 = graph_ids;
  support_relative_local = support_relative;
  already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_saved_node_ids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (verbose) {
    println<char[18],int,char[8],double,char[3],int,char[20],double>
              ((char (*) [18])"FREQUENT PATTERN ",&results->saved_instances,(char (*) [8])", SUP: ",
               &support_relative_local,(char (*) [3])0x1298f3,&pattern_support_absolute_local,
               (char (*) [20])" INSTANCES), CONF: ",&confidence_local);
  }
  result_edge._M_elems._0_8_ = SEXT48(pattern_support_absolute_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&results->support_absolute,(unsigned_long *)&result_edge);
  std::vector<double,_std::allocator<double>_>::push_back(&results->support,&support_relative_local)
  ;
  if (0.0 <= confidence_local) {
    std::vector<double,_std::allocator<double>_>::push_back(&results->confidence,&confidence_local);
  }
  local_9c = (undefined4)CONCAT71(in_register_00000009,set_of_graphs);
  local_90 = &results->result_nodes;
  lVar4 = 0;
  uVar5 = 0;
  local_80 = pu;
  while( true ) {
    this = local_80;
    paVar1 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x28) <= uVar5)
    break;
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&already_saved_node_ids,(key_type *)((long)paVar1->_M_elems + lVar4));
    if (sVar3 == 0) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &already_saved_node_ids,
                 (int *)((long)((edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4));
      paVar1 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar4);
      result_edge._M_elems[0] = results->saved_instances;
      result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar4 + 8);
      result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar4 + 0xc);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (local_90,(value_type *)&result_edge);
    }
    sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&already_saved_node_ids,
                       (key_type *)
                       ((long)((edge_list->
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4 + 4));
    if (sVar3 == 0) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &already_saved_node_ids,
                 (int *)((long)((edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar4 + 4));
      paVar1 = (edge_list->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar4 + 4);
      result_edge._M_elems[0] = results->saved_instances;
      result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar4 + 0x1c);
      result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar4 + 0x20);
      std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
                (local_90,(value_type *)&result_edge);
    }
    paVar1 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    result_edge._M_elems[1] = *(int *)((long)paVar1->_M_elems + lVar4);
    result_edge._M_elems[0] = results->saved_instances;
    result_edge._M_elems[2] = *(int *)((long)paVar1->_M_elems + lVar4 + 4);
    result_edge._M_elems[3] = *(int *)((long)paVar1->_M_elems + lVar4 + 0x14);
    result_edge._M_elems[5] = *(int *)((long)paVar1->_M_elems + lVar4 + 0x18);
    result_edge._M_elems[4] = *(int *)((long)paVar1->_M_elems + lVar4 + 0x10);
    std::vector<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>::push_back
              (&results->result_edges,&result_edge);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x28;
  }
  if ((char)local_9c == '\0') {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&result_edge,local_98);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results->occurrences,(value_type *)&result_edge);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&result_edge);
  }
  else {
    result_edge._M_elems[2] = 0;
    result_edge._M_elems[4] = 0;
    result_edge._M_elems[5] = 0;
    for (uVar5 = 0;
        piVar2 = (local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(local_98->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
        uVar5 = uVar5 + 1) {
      occurrences_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           PartialUnion::queryMappingSnapshotsToGraphs(this,piVar2[uVar5]);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &result_edge,(int *)&occurrences_vector);
    }
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&occurrences_vector,
               (_Base_ptr)(result_edge._M_elems + 2),(_Base_ptr)(result_edge._M_elems + 2),&local_dd
              );
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&results->occurrences,&occurrences_vector);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&occurrences_vector.super__Vector_base<int,_std::allocator<int>_>);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &result_edge);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&already_saved_node_ids._M_t);
  return;
}

Assistant:

void save_pattern(std::vector<std::array<int, 10>> &edge_list, std::vector<int> &graph_ids, results_crate * results,
                      bool set_of_graphs, PartialUnion pu, int pattern_support_absolute, double support_relative,
                      std::set<int> &antecedent_occurrences, double confidence = -1.0, bool verbose = false)
	{
		results->saved_instances++;

		std::set<int> already_saved_node_ids;
        debug_println(verbose, "FREQUENT PATTERN ", results->saved_instances, ", SUP: ", support_relative, " (",
                      pattern_support_absolute, " INSTANCES), CONF: ", confidence);

		results->support_absolute.push_back(pattern_support_absolute);
		results->support.push_back(support_relative);
		if (confidence >= 0)
		{
			results->confidence.push_back(confidence);
		}


		for (size_t i = 0; i < edge_list.size(); i++)
		{
			if (already_saved_node_ids.count(edge_list[i][0]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][0]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][0], edge_list[i][2], edge_list[i][3] };
				results->result_nodes.push_back(result_node);
			}
			if (already_saved_node_ids.count(edge_list[i][1]) == 0)
			{
				already_saved_node_ids.insert(edge_list[i][1]);
				std::array<int, 4> result_node = { results->saved_instances, edge_list[i][1], edge_list[i][7], edge_list[i][8] };
				results->result_nodes.push_back(result_node);
			}

			std::array<int, 6> result_edge = { results->saved_instances, edge_list[i][0], edge_list[i][1], edge_list[i][5], edge_list[i][4], edge_list[i][6] };
			results->result_edges.push_back(result_edge);
		}

		if (set_of_graphs)
		{
			std::set<int> occurrences_set;
			for (int j = 0; j < graph_ids.size(); j++)
			{
				occurrences_set.insert(pu.queryMappingSnapshotsToGraphs(graph_ids[j]));
			}
			std::vector<int> occurrences_vector(occurrences_set.begin(), occurrences_set.end());
			results->occurrences.push_back(occurrences_vector);
		}
		else
		{

			std::vector<int> new_(graph_ids);
			results->occurrences.push_back(new_);
		}
	}